

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int map_assign(wally_map *src,wally_map *dst,_func_int_uchar_ptr_size_t *check_fn)

{
  wally_map_item *pwVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  wally_map result;
  
  if (src == (wally_map *)0x0) {
    wally_clear(&result,0x18);
    result.items_allocation_len = 0;
LAB_00104a8d:
    wally_map_clear(dst);
    dst->items = result.items;
    dst->num_items = result.num_items;
    dst->items_allocation_len = result.items_allocation_len;
    iVar2 = 0;
  }
  else {
    iVar2 = wally_map_init(src->items_allocation_len,&result);
    if (iVar2 == 0) {
      uVar4 = 0xffffffffffffffff;
      lVar3 = 0x18;
      do {
        uVar4 = uVar4 + 1;
        if (src->num_items <= uVar4) goto LAB_00104a8d;
        pwVar1 = src->items;
        iVar2 = map_add(&result,*(uchar **)((long)pwVar1 + lVar3 + -0x18),
                        *(size_t *)((long)pwVar1 + lVar3 + -0x10),
                        *(uchar **)((long)pwVar1 + lVar3 + -8),
                        *(size_t *)((long)&pwVar1->key + lVar3),false,check_fn,true);
        lVar3 = lVar3 + 0x20;
      } while (iVar2 == 0);
    }
    wally_map_clear(&result);
  }
  return iVar2;
}

Assistant:

static int map_assign(const struct wally_map *src, struct wally_map *dst,
                      int (*check_fn)(const unsigned char *key, size_t key_len))
{
    struct wally_map result;
    size_t i;
    int ret = WALLY_OK;

    if (!src)
        ret = wally_map_init(0, &result);
    else {
        ret = wally_map_init(src->items_allocation_len, &result);
        for (i = 0; ret == WALLY_OK && i < src->num_items; ++i)
            ret = map_add(&result, src->items[i].key, src->items[i].key_len,
                          src->items[i].value, src->items[i].value_len,
                          false, check_fn, true);
    }

    if (ret != WALLY_OK)
        wally_map_clear(&result);
    else {
        wally_map_clear(dst);
        memcpy(dst, &result, sizeof(result));
    }
    return ret;
}